

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * valueAsString<char_const*>(string *__return_storage_ptr__,char *value)

{
  char *local_48;
  allocator local_19;
  char *local_18;
  char *value_local;
  
  local_48 = value;
  if (value == (char *)0x0) {
    local_48 = "(unset)";
  }
  local_18 = value;
  value_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_48,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<const char*>(const char* value)
{
  return value ? value : "(unset)";
}